

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void FStat::DumpRegisteredStats(void)

{
  undefined8 uVar1;
  FStat *pFVar2;
  
  pFVar2 = FirstStat;
  Printf("Available stats:\n");
  if (pFVar2 != (FStat *)0x0) {
    do {
      uVar1 = 0x20;
      if (pFVar2->m_Active != false) {
        uVar1 = 0x2a;
      }
      Printf(" %c%s\n",uVar1,pFVar2->m_Name);
      pFVar2 = pFVar2->m_Next;
    } while (pFVar2 != (FStat *)0x0);
  }
  return;
}

Assistant:

void FStat::DumpRegisteredStats ()
{
	FStat *stat = FirstStat;

	Printf ("Available stats:\n");
	while (stat)
	{
		Printf (" %c%s\n", stat->m_Active ? '*' : ' ', stat->m_Name);
		stat = stat->m_Next;
	}
}